

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O1

void drawChar(int x,int y,int c)

{
  byte bVar1;
  int _x;
  long lVar2;
  int iVar3;
  long lVar4;
  
  iVar3 = y * 0x80 + x;
  lVar4 = 0;
  do {
    bVar1 = font_data[lVar4 + (long)(int)(c & 0xfffffeff) * 6];
    lVar2 = 0;
    do {
      jedi_screen_buffer[iVar3 + (int)lVar2] =
           -((((uint)(byte)(bVar1 ^ (byte)((c << 0x17) >> 0x1f)) << ((byte)lVar2 & 0x1f)) >> 3 & 1)
            != 0);
      lVar2 = lVar2 + 1;
    } while (lVar2 != 4);
    lVar4 = lVar4 + 1;
    iVar3 = iVar3 + 0x80;
  } while (lVar4 != 6);
  return;
}

Assistant:

static void drawChar(int x, int y, int c)
{
    bool inverted = (c & DISPLAY_INVERT);
    c &=~DISPLAY_INVERT;
    
    for(int _y=0; _y<6; _y++)
    {
        uint8_t row = font_data[c*6+_y];
        if (inverted)
            row = ~row;
        for(int _x=0; _x<4; _x++)
        {
            jedi_screen_buffer[x+_x + (y+_y) * DISPLAY_WIDTH] = (row & (0b1000 >> _x)) ? 255 : 0;
        }
    }
}